

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::BringWindowToFocusFront(ImGuiWindow *window)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  int i;
  ImGuiWindow **ppIVar3;
  int local_24;
  int n;
  int new_order;
  int cur_order;
  ImGuiContext *g;
  ImGuiWindow *window_local;
  
  pIVar2 = GImGui;
  if (window != window->RootWindow) {
    __assert_fail("window == window->RootWindow",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                  ,0x190a,"void ImGui::BringWindowToFocusFront(ImGuiWindow *)");
  }
  local_24 = (int)window->FocusOrder;
  ppIVar3 = ImVector<ImGuiWindow_*>::operator[](&GImGui->WindowsFocusOrder,local_24);
  if (*ppIVar3 != window) {
    __assert_fail("g.WindowsFocusOrder[cur_order] == window",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                  ,0x190d,"void ImGui::BringWindowToFocusFront(ImGuiWindow *)");
  }
  ppIVar3 = ImVector<ImGuiWindow_*>::back(&pIVar2->WindowsFocusOrder);
  if (*ppIVar3 != window) {
    i = (pIVar2->WindowsFocusOrder).Size + -1;
    for (; local_24 < i; local_24 = local_24 + 1) {
      ppIVar3 = ImVector<ImGuiWindow_*>::operator[](&pIVar2->WindowsFocusOrder,local_24 + 1);
      pIVar1 = *ppIVar3;
      ppIVar3 = ImVector<ImGuiWindow_*>::operator[](&pIVar2->WindowsFocusOrder,local_24);
      *ppIVar3 = pIVar1;
      ppIVar3 = ImVector<ImGuiWindow_*>::operator[](&pIVar2->WindowsFocusOrder,local_24);
      (*ppIVar3)->FocusOrder = (*ppIVar3)->FocusOrder + -1;
      ppIVar3 = ImVector<ImGuiWindow_*>::operator[](&pIVar2->WindowsFocusOrder,local_24);
      if ((*ppIVar3)->FocusOrder != local_24) {
        __assert_fail("g.WindowsFocusOrder[n]->FocusOrder == n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                      ,0x1916,"void ImGui::BringWindowToFocusFront(ImGuiWindow *)");
      }
    }
    ppIVar3 = ImVector<ImGuiWindow_*>::operator[](&pIVar2->WindowsFocusOrder,i);
    *ppIVar3 = window;
    window->FocusOrder = (short)i;
  }
  return;
}

Assistant:

void ImGui::BringWindowToFocusFront(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(window == window->RootWindow);

    const int cur_order = window->FocusOrder;
    IM_ASSERT(g.WindowsFocusOrder[cur_order] == window);
    if (g.WindowsFocusOrder.back() == window)
        return;

    const int new_order = g.WindowsFocusOrder.Size - 1;
    for (int n = cur_order; n < new_order; n++)
    {
        g.WindowsFocusOrder[n] = g.WindowsFocusOrder[n + 1];
        g.WindowsFocusOrder[n]->FocusOrder--;
        IM_ASSERT(g.WindowsFocusOrder[n]->FocusOrder == n);
    }
    g.WindowsFocusOrder[new_order] = window;
    window->FocusOrder = (short)new_order;
}